

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBAmrUtil.cpp
# Opt level: O0

void amrex::TagCutCells(TagBoxArray *tags,MultiFab *state)

{
  bool bVar1;
  int iVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  FabArray<amrex::TagBox> *this;
  MFIter *in_RSI;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_amrex::EBCellFlag> *flagarr;
  Array4<char> *tagarr;
  FabType typ;
  EBCellFlagFab *flag;
  Box *bx;
  MFIter mfi;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  char tagval;
  MFIter *in_stack_fffffffffffffc68;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffc70;
  MFIter *mfi_00;
  int local_374;
  int local_370;
  undefined4 in_stack_fffffffffffffc94;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  int in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  undefined8 local_2e8;
  MFIter local_2e0;
  Box *in_stack_fffffffffffffd90;
  FBData<amrex::EBCellFlagFab> *this_00;
  MFIter local_260;
  MultiArray4<amrex::EBCellFlag> local_200;
  MultiArray4<const_amrex::EBCellFlag> local_1f8;
  undefined1 local_1e9;
  MFIter *local_1e8;
  EBCellFlagFab *local_1d8;
  _func_int **local_1d0;
  int local_1c8;
  _Head_base<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_false> local_1c0;
  int local_1b4;
  int iStack_1b0;
  int local_1ac;
  undefined8 local_1a8;
  int local_1a0;
  FBData<amrex::EBCellFlagFab> *local_198;
  int local_190;
  int iStack_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  FabArray<amrex::EBCellFlagFab> *local_178;
  EBCellFlag *local_170;
  int local_164;
  int local_160;
  int local_15c;
  MFIter *local_158;
  undefined4 local_14c;
  int *local_148;
  undefined4 local_13c;
  int *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  FBData<amrex::EBCellFlagFab> *local_118;
  undefined4 local_10c;
  FBData<amrex::EBCellFlagFab> *local_108;
  undefined4 local_fc;
  FBData<amrex::EBCellFlagFab> *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffc94 >> 0x18);
  local_1e9 = 2;
  local_1e8 = in_RSI;
  pFVar3 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x1188fec);
  this = (FabArray<amrex::TagBox> *)
         __dynamic_cast(pFVar3,&FabFactory<amrex::FArrayBox>::typeinfo,&EBFArrayBoxFactory::typeinfo
                        ,0);
  if (this != (FabArray<amrex::TagBox> *)0x0) {
    local_1f8.hp = (Array4<const_amrex::EBCellFlag> *)this;
    local_200.hp = (Array4<amrex::EBCellFlag> *)
                   EBFArrayBoxFactory::getMultiEBCellFlagFab
                             ((EBFArrayBoxFactory *)in_stack_fffffffffffffc70);
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc98,(bool)do_tiling_);
    mfi_00 = local_1e8;
    while (bVar1 = MFIter::isValid(&local_260), bVar1) {
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      this_00 = (FBData<amrex::EBCellFlagFab> *)((long)&local_2e0.num_local_tiles + 4);
      local_2e0.local_tile_index_map =
           (Vector<int,_std::allocator<int>_> *)
           FabArray<amrex::EBCellFlagFab>::operator[]
                     (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      local_2e0.tile_array._4_4_ =
           EBCellFlagFab::getType((EBCellFlagFab *)this_00,in_stack_fffffffffffffd90);
      if ((local_2e0.tile_array._4_4_ != regular) && (local_2e0.tile_array._4_4_ != covered)) {
        in_stack_fffffffffffffc68 = &local_2e0;
        FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(this,mfi_00);
        local_1d8 = (EBCellFlagFab *)local_2e0.local_tile_index_map;
        local_a8 = ((BaseFab<amrex::EBCellFlag> *)
                   &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->dptr
        ;
        local_b0 = &((BaseFab<amrex::EBCellFlag> *)
                    &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                    domain;
        local_b4 = ((BaseFab<amrex::EBCellFlag> *)
                   &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->nvar
        ;
        local_5c = 0;
        local_88 = (local_b0->smallend).vect[0];
        local_6c = 1;
        iStack_84 = (((BaseFab<amrex::EBCellFlag> *)
                     &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                    domain).smallend.vect[1];
        local_d0.x = (local_b0->smallend).vect[0];
        local_d0.y = (local_b0->smallend).vect[1];
        local_7c = 2;
        local_d0.z = (((BaseFab<amrex::EBCellFlag> *)
                      &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                     domain).smallend.vect[2];
        local_8 = &(((BaseFab<amrex::EBCellFlag> *)
                    &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                   domain).bigend;
        local_c = 0;
        local_38 = local_8->vect[0] + 1;
        local_18 = &(((BaseFab<amrex::EBCellFlag> *)
                     &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                    domain).bigend;
        local_1c = 1;
        iStack_34 = (((BaseFab<amrex::EBCellFlag> *)
                     &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                    domain).bigend.vect[1] + 1;
        local_28 = &(((BaseFab<amrex::EBCellFlag> *)
                     &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                    domain).bigend;
        local_2c = 2;
        local_f0.z = (((BaseFab<amrex::EBCellFlag> *)
                      &(local_2e0.local_tile_index_map)->super_vector<int,_std::allocator<int>_>)->
                     domain).bigend.vect[2] + 1;
        local_f0.y = iStack_34;
        local_f0.x = local_38;
        in_stack_fffffffffffffc70 = (FabArray<amrex::EBCellFlagFab> *)&stack0xfffffffffffffcd8;
        local_2e0.local_index_map = (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc68;
        local_e0._0_8_ = local_f0._0_8_;
        local_e0.z = local_f0.z;
        local_c0._0_8_ = local_d0._0_8_;
        local_c0.z = local_d0.z;
        local_a0._0_8_ = local_d0._0_8_;
        local_a0.z = local_d0.z;
        local_90 = local_b0;
        local_80 = local_d0.z;
        local_78 = local_b0;
        local_68 = local_b0;
        local_58 = local_b0;
        local_50._0_8_ = local_f0._0_8_;
        local_50.z = local_f0.z;
        local_40 = local_b0;
        local_30 = local_f0.z;
        Array4<const_amrex::EBCellFlag>::Array4
                  ((Array4<const_amrex::EBCellFlag> *)in_stack_fffffffffffffc70,local_a8,&local_c0,
                   &local_e0,local_b4);
        local_fc = 0;
        local_1b4 = *(int *)&((BaseFab<amrex::EBCellFlag> *)&this_00->fb)->_vptr_BaseFab;
        local_10c = 1;
        iStack_1b0 = *(int *)((long)&((BaseFab<amrex::EBCellFlag> *)&this_00->fb)->_vptr_BaseFab + 4
                             );
        local_1d0 = ((BaseFab<amrex::EBCellFlag> *)&this_00->fb)->_vptr_BaseFab;
        local_11c = 2;
        in_stack_fffffffffffffcd0 = *(int *)&((DataAllocator *)&this_00->scomp)->m_arena;
        local_128 = &this_00->ncomp;
        local_12c = 0;
        local_190 = *local_128;
        local_138 = &this_00->ncomp;
        local_13c = 1;
        iStack_18c = *(int *)&this_00->the_recv_data;
        local_1a8 = *(undefined8 *)local_128;
        local_148 = &this_00->ncomp;
        local_14c = 2;
        local_1a0 = *(int *)((long)&this_00->the_recv_data + 4);
        for (iVar2 = in_stack_fffffffffffffcd0; local_370 = iStack_1b0,
            local_2e8 = in_stack_fffffffffffffc70, local_1c8 = in_stack_fffffffffffffcd0,
            local_1c0._M_head_impl = this_00, local_1ac = in_stack_fffffffffffffcd0,
            local_198 = this_00, local_188 = local_1a0, local_118 = this_00, local_108 = this_00,
            local_f8 = this_00, iVar2 <= local_1a0; iVar2 = iVar2 + 1) {
          for (; local_374 = local_1b4, local_370 <= iStack_18c; local_370 = local_370 + 1) {
            for (; local_374 <= local_190; local_374 = local_374 + 1) {
              local_17c = local_374;
              local_180 = local_370;
              local_170 = (EBCellFlag *)
                          (in_stack_fffffffffffffc70->super_FabArrayBase)._vptr_FabArrayBase +
                          (long)(local_374 -
                                ((Dim3 *)&(in_stack_fffffffffffffc70->super_FabArrayBase).boxarray.
                                          m_bat.m_op.m_bndryReg.m_loshft)->x) +
                          (long)(local_370 -
                                ((Dim3 *)&(in_stack_fffffffffffffc70->super_FabArrayBase).boxarray.
                                          m_bat.m_op.m_bndryReg.m_loshft)->y) *
                          *(long *)&(in_stack_fffffffffffffc70->super_FabArrayBase).boxarray.m_bat +
                          (long)(iVar2 - ((Dim3 *)&(in_stack_fffffffffffffc70->super_FabArrayBase).
                                                   boxarray.m_bat.m_op.m_bndryReg.m_loshft)->z) *
                          *(long *)&(in_stack_fffffffffffffc70->super_FabArrayBase).boxarray.m_bat.
                                    m_op.m_bndryReg.m_typ.itype;
              if ((local_170->flag & 3) == 1) {
                local_158 = (MFIter *)local_2e0.local_index_map;
                local_15c = local_374;
                local_160 = local_370;
                *(undefined1 *)
                 ((long)&((((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                             *)&(local_2e0.local_index_map)->super_vector<int,_std::allocator<int>_>
                           )->_M_t).
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                         _vptr_FabArrayBase +
                 (long)(local_374 - *(int *)((long)local_2e0.local_index_map + 0x20)) +
                 (long)(local_370 - *(int *)((long)local_2e0.local_index_map + 0x24)) *
                 (long)*(FabArrayBase **)((long)local_2e0.local_index_map + 8) +
                 (long)(iVar2 - *(int *)((long)local_2e0.local_index_map + 0x28)) *
                 *(long *)((IntVect *)((long)local_2e0.local_index_map + 0x10))->vect) = 2;
                local_164 = iVar2;
              }
              local_184 = iVar2;
              local_178 = in_stack_fffffffffffffc70;
            }
          }
        }
      }
      MFIter::operator++(&local_260);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffffc70);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
TagCutCells (TagBoxArray& tags, const MultiFab& state)
{
    const char   tagval = TagBox::SET;
//    const char clearval = TagBox::CLEAR;

    auto const& factory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());
    auto const& flags = factory.getMultiEBCellFlagFab();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(state, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        const auto& flag = flags[mfi];

        const FabType typ = flag.getType(bx);
        if (typ != FabType::regular && typ != FabType::covered)
        {
            Array4<char> const& tagarr = tags.array(mfi);
            Array4<EBCellFlag const> const& flagarr = flag.const_array();
            AMREX_HOST_DEVICE_FOR_3D (bx, i, j, k,
            {
                if (flagarr(i,j,k).isSingleValued()) {
                    tagarr(i,j,k) = tagval;
                }
            });
        }
    }
}